

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O2

int __thiscall UnixMakefileGenerator::init(UnixMakefileGenerator *this,EVP_PKEY_CTX *ctx)

{
  char16_t **ppcVar1;
  long lVar2;
  QString file;
  FILE *__stream;
  Data *pDVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  QList<ProString> *pQVar9;
  QArrayDataPointer<ProString> *pQVar10;
  QArrayDataPointer<ProString> *pQVar11;
  QList<ProString> *pQVar12;
  pointer pQVar13;
  iterator iVar14;
  iterator iVar15;
  char16_t *pcVar16;
  qsizetype qVar17;
  ProStringList *pPVar18;
  QString *pQVar19;
  long lVar20;
  ProStringList *this_00;
  ProStringList *value;
  ProString *iif;
  QMakeProject *pQVar21;
  int i_1;
  ulong uVar22;
  ProString *pPVar23;
  char *pcVar24;
  EVP_PKEY_CTX *ctx_00;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
  *pQVar25;
  char *ch;
  QArrayDataPointer<char16_t> *this_01;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
  *pQVar26;
  int i;
  QMakeProject **ppQVar27;
  UnixMakefileGenerator *pUVar28;
  QMakeProject **ppQVar29;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffce8;
  QMakeProject **ppQVar30;
  UnixMakefileGenerator *pUVar31;
  ProKey local_2e8;
  ProString local_2b8;
  QArrayDataPointer<char16_t> local_288;
  undefined1 local_268 [32];
  undefined1 local_248 [24];
  QArrayDataPointer<char16_t> local_230;
  QArrayDataPointer<ProString> local_218;
  QArrayDataPointer<ProString> local_1f8;
  QArrayDataPointer<char16_t> local_1e0;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<QString> local_1a8;
  ProKey local_190;
  QArrayDataPointer<char16_t> local_160;
  ProKey runCompImp;
  ProKey runComp;
  ProString compilerVariable;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
  local_b0;
  ProString target;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  ppQVar29 = &(this->super_MakefileGenerator).project;
  pQVar21 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&target,"CONFIG");
  pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
            super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&target,"ICON");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  ppQVar27 = ppQVar29;
  if (bVar4) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&local_b0,"RC_FILE");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    if (!bVar4) {
      pQVar21 = *ppQVar29;
      ProKey::ProKey((ProKey *)&target,"RC_FILE");
      pQVar10 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
      pQVar21 = *ppQVar27;
      ppQVar29 = ppQVar27;
      ProKey::ProKey((ProKey *)&local_b0,"ICON");
      ppQVar27 = ppQVar29;
      pQVar11 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
      QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
      goto LAB_00174fbb;
    }
  }
  else {
LAB_00174fbb:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_EXTENSION_PLUGIN");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  if (bVar4) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&target,"QMAKE_EXTENSION_PLUGIN");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
               super_QList<ProString>;
    pQVar21 = *ppQVar27;
    ppQVar29 = ppQVar27;
    ProKey::ProKey((ProKey *)&compilerVariable,"QMAKE_EXTENSION_SHLIB");
    ppQVar27 = ppQVar29;
    QMakeEvaluator::first
              ((ProString *)&local_b0,&pQVar21->super_QMakeEvaluator,(ProKey *)&compilerVariable);
    QList<ProString>::emplaceBack<ProString>(pQVar12,(ProString *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&compilerVariable);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"TARGET");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&local_b0,"QMAKE_ORIG_TARGET");
  ppQVar29 = ppQVar27;
  pQVar11 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
  QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&target,"VERSION");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  if (bVar4) {
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&local_b0,"VERSION");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
               super_QList<ProString>;
    pQVar21 = *ppQVar27;
    ProKey::ProKey(&runCompImp,"VER_PAT");
    bVar4 = QMakeProject::isEmpty(pQVar21,&runCompImp);
    if (bVar4) {
      QString::QString((QString *)&local_160,"0");
      ProString::ProString(&runComp.super_ProString,(QString *)&local_160);
      ppQVar27 = ppQVar29;
    }
    else {
      pQVar21 = *ppQVar27;
      ProKey::ProKey(&local_190,"VER_PAT");
      QMakeEvaluator::first(&runComp.super_ProString,&pQVar21->super_QMakeEvaluator,&local_190);
      ppQVar27 = ppQVar29;
    }
    ppcVar1 = &target.m_string.d.ptr;
    target.m_string.d.d = (Data *)anon_var_dwarf_1c1ea0;
    ProString::ProString((ProString *)ppcVar1,&runComp.super_ProString);
    ProString::ProString<char_const(&)[5],ProString>
              (&compilerVariable,(QStringBuilder<const_char_(&)[5],_ProString> *)&target);
    QList<ProString>::emplaceBack<ProString>(pQVar12,&compilerVariable);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&compilerVariable);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)ppcVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&runComp.super_ProString);
    if (bVar4) {
      this_01 = &local_160;
    }
    else {
      this_01 = (QArrayDataPointer<char16_t> *)&local_190;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
    ppQVar29 = ppQVar27;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runCompImp);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  }
  local_1a8.size = -0x5555555555555556;
  local_1a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1a8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&local_b0,"VERSION");
  QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
  ProString::toQString(&compilerVariable.m_string,&target);
  QString::split(&local_1a8,&compilerVariable,0x2e,0,1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&compilerVariable);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QString::QString(&target.m_string,"0");
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1a8,&target.m_string);
  QString::QString((QString *)&local_b0,"0");
  QList<QString>::emplaceBack<QString>((QList<QString> *)&local_1a8,(QString *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&target,"VER_MAJ");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
             super_QList<ProString>;
  pQVar13 = QList<QString>::data((QList<QString> *)&local_1a8);
  ProString::ProString((ProString *)&local_b0,pQVar13);
  QList<ProString>::emplaceBack<ProString>(pQVar12,(ProString *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&target,"VER_MIN");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
             super_QList<ProString>;
  pQVar13 = QList<QString>::data((QList<QString> *)&local_1a8);
  ProString::ProString((ProString *)&local_b0,pQVar13 + 1);
  QList<ProString>::emplaceBack<ProString>(pQVar12,(ProString *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&target,"VER_PAT");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
             super_QList<ProString>;
  pQVar13 = QList<QString>::data((QList<QString> *)&local_1a8);
  ProString::ProString((ProString *)&local_b0,pQVar13 + 2);
  QList<ProString>::emplaceBack<ProString>(pQVar12,(ProString *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  local_1c8.size = -0x5555555555555556;
  local_1c8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1c8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  QMakeProject::sourceRoot((QString *)&local_1c8,*ppQVar27);
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&target,"QMAKE_INTERNAL_INCLUDED_FILES");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
             super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  iVar14 = QList<ProString>::begin(pQVar12);
  iVar15 = QList<ProString>::end(pQVar12);
  for (; iVar14.i != iVar15.i; iVar14.i = iVar14.i + 1) {
    pQVar21 = *ppQVar29;
    target.m_string.d.d = (pQVar21->super_QMakeEvaluator).m_cachefile.d.d;
    target.m_string.d.ptr = (pQVar21->super_QMakeEvaluator).m_cachefile.d.ptr;
    target.m_string.d.size = (pQVar21->super_QMakeEvaluator).m_cachefile.d.size;
    if (target.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((target.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((target.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1
      ;
      UNLOCK();
    }
    bVar4 = ProString::operator==(iVar14.i,&target.m_string);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    pUVar31 = this;
    if ((!bVar4) &&
       (bVar4 = ProString::startsWith(iVar14.i,(QString *)&local_1c8,CaseSensitive), pUVar31 = this,
       bVar4)) {
      pcVar16 = ((iVar14.i)->m_string).d.ptr;
      if (pcVar16 == (char16_t *)0x0) {
        pcVar16 = (char16_t *)&QString::_empty;
      }
      if (pcVar16[(long)(iVar14.i)->m_offset + (long)(int)local_1c8.size] == L'/') {
        ProString::toQString((QString *)&runComp,iVar14.i);
        pUVar31 = this;
        MakefileGenerator::fileFixify
                  (&compilerVariable.m_string,&this->super_MakefileGenerator,(QString *)&runComp,
                   (FileFixifyTypes)0x8,true);
        ProString::ProString(&target,&compilerVariable.m_string);
        pQVar21 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_b0,"DISTFILES");
        pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
                   super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar12,&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerVariable);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
      }
    }
    this = pUVar31;
  }
  pQVar21 = *ppQVar29;
  ppQVar27 = ppQVar29;
  ProKey::ProKey((ProKey *)&local_b0,"TEMPLATE");
  QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
  bVar4 = ProString::operator==(&target,"app");
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  if (bVar4) {
    pQVar21 = *ppQVar29;
    pcVar24 = "QMAKE_APP_FLAG";
LAB_00175717:
    ProKey::ProKey((ProKey *)&target,pcVar24);
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
               super_QList<ProString>;
    ProString::ProString((ProString *)&local_b0,"1");
    QList<ProString>::emplaceBack<ProString>(pQVar12,(ProString *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  else {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&local_b0,"TEMPLATE");
    QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
    bVar4 = ProString::operator==(&target,"lib");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    if (bVar4) {
      pQVar21 = *ppQVar29;
      pcVar24 = "QMAKE_LIB_FLAG";
      goto LAB_00175717;
    }
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&local_b0,"TEMPLATE");
    QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
    ctx_00 = (EVP_PKEY_CTX *)0x2221aa;
    bVar4 = ProString::operator==(&target,"subdirs");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    if (bVar4) {
      MakefileGenerator::init(&this->super_MakefileGenerator,ctx_00);
      pQVar21 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)&target,"MAKEFILE");
      bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      if (bVar4) {
        pQVar21 = *ppQVar27;
        ProKey::ProKey((ProKey *)&target,"MAKEFILE");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
                  super_QList<ProString>;
        ProString::ProString((ProString *)&local_b0,"Makefile");
        QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      }
      goto LAB_00177733;
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"DESTDIR");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&local_b0,"QMAKE_ORIG_DESTDIR");
  pQVar11 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
  QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_LIB_FLAG");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  if (bVar4) {
LAB_00175833:
    pQVar21 = *ppQVar29;
    QString::QString((QString *)&local_b0,"qt");
    bVar6 = false;
    bVar5 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_b0,false);
    ppQVar29 = ppQVar27;
    if (bVar5) {
      pQVar21 = *ppQVar27;
      QString::QString(&compilerVariable.m_string,"plugin");
      bVar6 = QMakeProject::isActiveConfig(pQVar21,&compilerVariable.m_string,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&compilerVariable);
      ppQVar29 = ppQVar27;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    ppQVar27 = ppQVar29;
    if (!bVar4) goto LAB_001758ac;
  }
  else {
    pQVar21 = *ppQVar29;
    ppQVar29 = ppQVar27;
    QString::QString((QString *)&local_1e0,"staticlib");
    ppQVar27 = ppQVar29;
    bVar5 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_1e0,false);
    bVar6 = true;
    if (bVar5) goto LAB_00175833;
LAB_001758ac:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  if (bVar6 == false) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&target,"QMAKE_APP_FLAG");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
    if (bVar4) {
      pQVar21 = *ppQVar29;
      QString::QString((QString *)&local_b0,"dll");
      bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_b0,false);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      if (!bVar4) goto LAB_00175abb;
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    }
    ProStringList::removeAll((ProStringList *)pQVar9,"staticlib");
  }
  else {
    qVar17 = QtPrivate::indexOf<ProString,char[4]>(pQVar9,(char (*) [4])0x222494,0);
    if (qVar17 == -1) {
      ProString::ProString(&target,"dll");
      QList<ProString>::emplaceBack<ProString>(pQVar9,&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    }
  }
LAB_00175abb:
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_INCREMENTAL");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar29;
  if (bVar4) {
    ProKey::ProKey((ProKey *)&target,"QMAKE_LFLAGS_PREBIND");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
    if (bVar4) goto LAB_00175c2f;
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&local_b0,"QMAKE_LIB_FLAG");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
    if ((pPVar18->super_QList<ProString>).d.size == 0) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
      goto LAB_00175c2f;
    }
    pQVar21 = *ppQVar29;
    QString::QString(&compilerVariable.m_string,"dll");
    bVar4 = QMakeProject::isActiveConfig(pQVar21,&compilerVariable.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&compilerVariable);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    if (bVar4) {
      pQVar21 = *ppQVar29;
      pcVar24 = "QMAKE_LFLAGS_PREBIND";
      ppQVar29 = ppQVar27;
      goto LAB_00175bb5;
    }
  }
  else {
    pcVar24 = "QMAKE_LFLAGS_INCREMENTAL";
    ppQVar29 = ppQVar27;
LAB_00175bb5:
    ProKey::ProKey((ProKey *)&target,pcVar24);
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
              super_QList<ProString>;
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&local_b0,"QMAKE_LFLAGS");
    ppQVar27 = ppQVar29;
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
               super_QList<ProString>;
    QList<ProString>::append(pQVar12,pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
LAB_00175c2f:
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_INCDIR_POST");
  pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
            super_QList<ProString>;
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&local_b0,"QMAKE_INCDIR");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
             super_QList<ProString>;
  QList<ProString>::append(pQVar12,pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_RPATHDIR_POST");
  pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
            super_QList<ProString>;
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&local_b0,"QMAKE_RPATHDIR");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
             super_QList<ProString>;
  QList<ProString>::append(pQVar12,pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_RPATHLINKDIR_POST");
  pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
            super_QList<ProString>;
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&local_b0,"QMAKE_RPATHLINKDIR");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
             super_QList<ProString>;
  QList<ProString>::append(pQVar12,pQVar9);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_INCDIR");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  ppQVar29 = ppQVar27;
  if (!bVar4) {
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&target,"QMAKE_INCDIR");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
              super_QList<ProString>;
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&local_b0,"INCLUDEPATH");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
               super_QList<ProString>;
    QList<ProString>::append(pQVar12,pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  local_1f8.size = -0x5555555555555556;
  local_1f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_1f8.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  pQVar21 = (this->super_MakefileGenerator).project;
  pUVar31 = this;
  ProKey::ProKey((ProKey *)&target,"QMAKE_LIBDIR_FLAGS");
  pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
  ProKey::ProKey((ProKey *)&local_b0,"QMAKE_LIBDIR");
  libdirToFlags((ProStringList *)&compilerVariable,this,(ProKey *)&local_b0);
  operator+((ProStringList *)&local_1f8,pPVar18,(ProStringList *)&compilerVariable);
  QArrayDataPointer<ProString>::~QArrayDataPointer
            ((QArrayDataPointer<ProString> *)&compilerVariable);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  local_218.size = -0x5555555555555556;
  local_218.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_218.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)&target,"QMAKE_LIBDIR_POST");
  libdirToFlags((ProStringList *)&local_218,this,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  pQVar21 = (this->super_MakefileGenerator).project;
  QString::QString(&target.m_string,"mac");
  bVar4 = QMakeProject::isActiveConfig(pQVar21,&target.m_string,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  ppQVar27 = ppQVar29;
  if (bVar4) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&target,"QMAKE_FRAMEWORKPATH");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    if (!bVar4) {
      pQVar21 = *ppQVar29;
      ProKey::ProKey((ProKey *)&target,"QMAKE_FRAMEWORKPATH");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      lVar20 = 0;
      for (uVar22 = 0; uVar22 < (ulong)(pPVar18->super_QList<ProString>).d.size; uVar22 = uVar22 + 1
          ) {
        pUVar28 = pUVar31;
        MakefileGenerator::escapeFilePath
                  (&compilerVariable,&pUVar31->super_MakefileGenerator,
                   (ProString *)
                   ((long)&(((pPVar18->super_QList<ProString>).d.ptr)->m_string).d.d + lVar20));
        target.m_string.d.d = (Data *)anon_var_dwarf_407d4;
        ProString::ProString((ProString *)&target.m_string.d.ptr,&compilerVariable);
        ProString::ProString<char_const(&)[3],ProString>
                  ((ProString *)&local_b0,(QStringBuilder<const_char_(&)[3],_ProString> *)&target);
        pQVar21 = (pUVar31->super_MakefileGenerator).project;
        ProKey::ProKey(&runComp,"QMAKE_FRAMEWORKPATH_FLAGS");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&runComp)->
                  super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&target.m_string.d.ptr);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerVariable);
        lVar20 = lVar20 + 0x30;
        pUVar31 = pUVar28;
      }
    }
    pQVar21 = *ppQVar29;
    ppQVar27 = ppQVar29;
    ProKey::ProKey((ProKey *)&target,"QMAKE_FRAMEWORKPATH_FLAGS");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
              super_QList<ProString>;
    QList<ProString>::append((QList<ProString> *)&local_1f8,pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"LIBS");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  operator+((ProStringList *)&target,(ProStringList *)&local_1f8,(ProStringList *)pQVar10);
  QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&target);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&target);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_LIBS");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  operator+((ProStringList *)&target,(ProStringList *)&local_218,(ProStringList *)pQVar10);
  QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&target);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&target);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&target,"QMAKE_RPATHDIR");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  if (bVar4) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  else {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)&local_b0,"QMAKE_LFLAGS_RPATH");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    if (!bVar4) {
      pQVar21 = *ppQVar27;
      ProKey::ProKey((ProKey *)&target,"QMAKE_RPATHDIR");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      lVar20 = 0;
      for (uVar22 = 0; uVar22 < (ulong)(pPVar18->super_QList<ProString>).d.size; uVar22 = uVar22 + 1
          ) {
        runCompImp.super_ProString.m_string.d.size = -0x5555555555555556;
        runCompImp.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        runCompImp.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        ProString::toQString
                  ((QString *)&runCompImp,
                   (ProString *)
                   ((long)&(((pPVar18->super_QList<ProString>).d.ptr)->m_string).d.d + lVar20));
        if ((((ulong)runCompImp.super_ProString.m_string.d.size < 2) ||
            (*runCompImp.super_ProString.m_string.d.ptr != L'$')) ||
           (runCompImp.super_ProString.m_string.d.ptr[1] == L'(')) {
          cVar7 = QString::startsWith((QChar)(char16_t)&runCompImp,0x40);
          if (cVar7 != '\0') goto LAB_00177bb0;
          local_230.d = runCompImp.super_ProString.m_string.d.d;
          local_230.ptr = runCompImp.super_ProString.m_string.d.ptr;
          local_230.size = runCompImp.super_ProString.m_string.d.size;
          if (runCompImp.super_ProString.m_string.d.d != (Data *)0x0) {
            LOCK();
            ((runCompImp.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 ((runCompImp.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          file.d.ptr = (char16_t *)ppQVar27;
          file.d.d = (Data *)in_stack_fffffffffffffce8;
          file.d.size = (qsizetype)pUVar31;
          MakefileGenerator::fileInfo((MakefileGenerator *)&target,file);
          cVar7 = QFileInfo::isRelative();
          QFileInfo::~QFileInfo((QFileInfo *)&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_230);
          if (cVar7 == '\0') goto LAB_00177bb0;
          compilerVariable.m_string.d.size = -0x5555555555555556;
          compilerVariable.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          compilerVariable.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          pQVar21 = *ppQVar27;
          ProKey::ProKey((ProKey *)&local_b0,"QMAKE_REL_RPATH_BASE");
          QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
          ProString::toQString(&compilerVariable.m_string,&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
          qVar17 = compilerVariable.m_string.d.size;
          __stream = _stderr;
          if (compilerVariable.m_string.d.size == 0) {
            QString::toLatin1_helper((QString *)&target);
            pcVar16 = target.m_string.d.ptr;
            if (target.m_string.d.ptr == (char16_t *)0x0) {
              pcVar16 = (char16_t *)&QByteArray::_empty;
            }
            fprintf(__stream,
                    "Error: This platform does not support relative paths in QMAKE_RPATHDIR (%s)\n",
                    pcVar16);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&target);
          }
          else {
            cVar7 = QString::startsWith((QChar)(char16_t)&compilerVariable,0x24);
            ppQVar29 = ppQVar27;
            if (cVar7 != '\0') {
              QString::QString(&target.m_string,"\\$$");
              QString::replace((longlong)&compilerVariable,0,(QString *)0x1);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
              ppQVar29 = ppQVar27;
            }
            bVar4 = comparesEqual((QString *)&runCompImp,".");
            if (bVar4) {
              QString::operator=((QString *)&runCompImp,(QString *)&compilerVariable);
            }
            else {
              local_b0.a.a.a.a = &compilerVariable.m_string;
              local_b0.a.a.a.b = (char (*) [2])CONCAT71(local_b0.a.a.a.b._1_7_,0x2f);
              QStringBuilder<QString_&,_char>::convertTo<QString>
                        (&target.m_string,(QStringBuilder<QString_&,_char> *)&local_b0);
              QString::prepend((QString *)&runCompImp,&target.m_string);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
            }
            pQVar21 = *ppQVar29;
            ppQVar27 = ppQVar29;
            ProKey::ProKey((ProKey *)&target,"QMAKE_LFLAGS");
            this_00 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
            pQVar21 = *ppQVar29;
            ProKey::ProKey((ProKey *)&local_b0,"QMAKE_LFLAGS_REL_RPATH");
            value = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
            ProStringList::insertUnique(this_00,value);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_b0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&compilerVariable);
          pUVar28 = pUVar31;
          if (qVar17 != 0) goto LAB_00177bb0;
        }
        else {
          QString::QString(&target.m_string,"\\$$");
          QString::replace((longlong)&runCompImp,0,(QString *)0x1);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
LAB_00177bb0:
          ProKey::ProKey((ProKey *)&compilerVariable,"QMAKE_LFLAGS_RPATH");
          pUVar28 = pUVar31;
          (*(pUVar31->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(&local_2b8,pUVar31,&compilerVariable);
          (*(pUVar31->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0xc])((QArrayDataPointer<char16_t> *)&local_2e8,pUVar31,&runCompImp);
          QStringBuilder<QString,_QString>::QStringBuilder
                    ((QStringBuilder<QString,_QString> *)&local_b0,&local_2b8.m_string,
                     (QString *)&local_2e8);
          ProString::ProString<QString,QString>
                    (&target,(QStringBuilder<QString,_QString> *)&local_b0);
          pQVar21 = (pUVar31->super_MakefileGenerator).project;
          ProKey::ProKey(&runComp,"QMAKE_LFLAGS");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&runComp)->
                    super_QList<ProString>;
          QList<ProString>::emplaceBack<ProString>(pQVar9,&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)&local_b0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&compilerVariable);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runCompImp);
        lVar20 = lVar20 + 0x30;
        pUVar31 = pUVar28;
      }
    }
  }
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&target,"QMAKE_RPATHLINKDIR");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  if (!bVar4) {
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&target,"QMAKE_RPATHLINKDIR");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    lVar20 = 0;
    for (uVar22 = 0; uVar22 < (ulong)(pPVar18->super_QList<ProString>).d.size; uVar22 = uVar22 + 1)
    {
      pQVar21 = *ppQVar27;
      ProKey::ProKey((ProKey *)&target,"QMAKE_LFLAGS_RPATHLINK");
      bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      pUVar28 = pUVar31;
      if (!bVar4) {
        ProKey::ProKey((ProKey *)&compilerVariable,"QMAKE_LFLAGS_RPATHLINK");
        pUVar28 = pUVar31;
        (*(pUVar31->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0x16])(&runCompImp,pUVar31,&compilerVariable);
        ProString::toQString
                  ((QString *)local_248,
                   (ProString *)
                   ((long)&(((pPVar18->super_QList<ProString>).d.ptr)->m_string).d.d + lVar20));
        QFileInfo::QFileInfo((QFileInfo *)local_268,(QString *)local_248);
        QFileInfo::absoluteFilePath();
        (*(pUVar31->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0xc])(&local_2b8,pUVar31,&local_2e8);
        QStringBuilder<QString,_QString>::QStringBuilder
                  ((QStringBuilder<QString,_QString> *)&local_b0,(QString *)&runCompImp,
                   &local_2b8.m_string);
        ProString::ProString<QString,QString>(&target,(QStringBuilder<QString,_QString> *)&local_b0)
        ;
        pQVar21 = (pUVar31->super_MakefileGenerator).project;
        ProKey::ProKey(&runComp,"QMAKE_LFLAGS");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&runComp)->
                  super_QList<ProString>;
        QList<ProString>::emplaceBack<ProString>(pQVar9,&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QStringBuilder<QString,_QString>::~QStringBuilder
                  ((QStringBuilder<QString,_QString> *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
        QFileInfo::~QFileInfo((QFileInfo *)local_268);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_248);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runCompImp);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerVariable);
      }
      lVar20 = lVar20 + 0x30;
      pUVar31 = pUVar28;
    }
  }
  pQVar21 = *ppQVar27;
  pQVar25 = &local_b0;
  ppQVar29 = ppQVar27;
  QString::QString((QString *)pQVar25,"GNUmake");
  bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)pQVar25,false);
  if (bVar4) {
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&target,"QMAKE_CFLAGS_DEPS");
    pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
               *)&target;
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    if (!bVar4) {
      pUVar31->include_deps = true;
    }
  }
  else {
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  }
  pUVar28 = pUVar31;
  MakefileGenerator::init(&pUVar31->super_MakefileGenerator,(EVP_PKEY_CTX *)pQVar25);
  pQVar21 = (pUVar31->super_MakefileGenerator).project;
  QString::QString(&target.m_string,"objective_c");
  bVar4 = QMakeProject::isActiveConfig(pQVar21,&target.m_string,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  if (bVar4) {
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&target,"QMAKE_BUILTIN_COMPILERS");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
              super_QList<ProString>;
    ProString::ProString((ProString *)&local_b0,"OBJC");
    QList<ProString>::emplaceBack<ProString_const&>(pQVar9,(ProString *)&local_b0);
    ProString::ProString(&compilerVariable,"OBJCXX");
    QList<ProString>::emplaceBack<ProString_const&>(pQVar9,&compilerVariable);
    ppQVar27 = ppQVar29;
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&compilerVariable);
    ppQVar29 = ppQVar27;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  }
  pQVar21 = *ppQVar27;
  ProKey::ProKey((ProKey *)&target,"QMAKE_BUILTIN_COMPILERS");
  pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
            super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  iVar14 = QList<ProString>::begin(pQVar9);
  iVar15 = QList<ProString>::end(pQVar9);
  for (; iVar14.i != iVar15.i; iVar14.i = iVar14.i + 1) {
    local_248._16_8_ = -0x5555555555555556;
    local_248._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
    local_248._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)&target,"QMAKE_COMPILE_FLAG");
    (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              ((QString *)local_248,pUVar28,&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    if (local_248._16_8_ == 0) {
      QString::operator=((QString *)local_248,"-c");
    }
    iVar8 = (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0x21])();
    if ((char)iVar8 != '\0') {
      pQVar21 = *ppQVar27;
      ProKey::ProKey((ProKey *)&target,"PRECOMPILED_HEADER");
      bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      if (!bVar4) {
        runComp.super_ProString.m_string.d.size = -0x5555555555555556;
        runComp.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        runComp.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_b0.a.a.a.a = (QString *)0x21ae12;
        local_b0.a.a.b = (QString *)0x21c2b1;
        local_b0.a.a.a.b = (char (*) [2])iVar14.i;
        ProString::ProString<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[21]>
                  (&target,(QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[21]>
                            *)&local_b0);
        pUVar31 = pUVar28;
        (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0x16])(&runComp,pUVar28,&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        runCompImp.super_ProString.m_string.d.d = (Data *)0x0;
        runCompImp.super_ProString.m_string.d.ptr = (char16_t *)0x0;
        runCompImp.super_ProString.m_string.d.size = 0;
        pQVar21 = (pUVar28->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&target,"PRECOMPILED_DIR");
        bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        if (!bVar4) {
          pQVar21 = *ppQVar29;
          ProKey::ProKey((ProKey *)&local_b0,"PRECOMPILED_DIR");
          QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
          ProString::toQString(&local_2b8.m_string,&target);
          Option::fixPathToTargetOS(&compilerVariable.m_string,&local_2b8.m_string,true,true);
          qVar17 = runCompImp.super_ProString.m_string.d.size;
          pcVar16 = runCompImp.super_ProString.m_string.d.ptr;
          pDVar3 = runCompImp.super_ProString.m_string.d.d;
          runCompImp.super_ProString.m_string.d.d = compilerVariable.m_string.d.d;
          runCompImp.super_ProString.m_string.d.ptr = compilerVariable.m_string.d.ptr;
          compilerVariable.m_string.d.d = pDVar3;
          compilerVariable.m_string.d.ptr = pcVar16;
          runCompImp.super_ProString.m_string.d.size = compilerVariable.m_string.d.size;
          compilerVariable.m_string.d.size = qVar17;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&compilerVariable);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
          cVar7 = QString::endsWith((QString *)&runCompImp,0x26bbd0);
          if (cVar7 == '\0') {
            QString::append((QString *)&runCompImp);
          }
        }
        pQVar21 = (pUVar31->super_MakefileGenerator).project;
        pUVar28 = pUVar31;
        ProKey::ProKey((ProKey *)&local_b0,"QMAKE_ORIG_TARGET");
        QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
        ProString::toQString(&compilerVariable.m_string,&target);
        QString::append((QString *)&runCompImp);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerVariable);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        pQVar19 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_INPUT}");
        pQVar21 = (pUVar31->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)&local_b0,"PRECOMPILED_HEADER");
        QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
        ProString::toQString(&local_2b8.m_string,&target);
        (*(pUVar31->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0xc])(&compilerVariable,pUVar31,&local_2b8);
        QString::replace((QLatin1String *)&runComp,pQVar19,0x21c2c6);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&compilerVariable);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        pQVar19 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_OUTPUT_BASE}");
        (*(pUVar31->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0xc])(&target,pUVar31,&runCompImp);
        QString::replace((QLatin1String *)&runComp,pQVar19,0x21c2d9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        pQVar21 = (pUVar31->super_MakefileGenerator).project;
        QString::QString(&target.m_string,"icc_pch_style");
        bVar4 = QMakeProject::isActiveConfig(pQVar21,&target.m_string,false);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        if (bVar4) {
          pQVar19 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_OUTPUT}");
          pQVar21 = (pUVar31->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)&compilerVariable,"QMAKE_PCH_OUTPUT_EXT");
          QMakeEvaluator::first
                    ((ProString *)&local_b0,&pQVar21->super_QMakeEvaluator,
                     (ProKey *)&compilerVariable);
          target.m_string.d.d = (Data *)&runCompImp;
          ppcVar1 = &target.m_string.d.ptr;
          ProString::ProString((ProString *)ppcVar1,(ProString *)&local_b0);
          MakefileGenerator::escapeFilePath<QString&,ProString>
                    (&local_2b8.m_string,&pUVar31->super_MakefileGenerator,
                     (QStringBuilder<QString_&,_ProString> *)&target);
          QString::replace((QLatin1String *)&runComp,pQVar19,0x21c300);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)ppcVar1);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&compilerVariable);
          compilerVariable.m_string.d.size = -0x5555555555555556;
          compilerVariable.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          compilerVariable.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          pQVar21 = (pUVar31->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)&target,"QMAKE_PCH_ARCHS");
          pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
          compilerVariable.m_string.d.d = (Data *)(pPVar18->super_QList<ProString>).d.d;
          compilerVariable.m_string.d.ptr = (char16_t *)(pPVar18->super_QList<ProString>).d.ptr;
          compilerVariable.m_string.d.size = (pPVar18->super_QList<ProString>).d.size;
          if (compilerVariable.m_string.d.d != (Data *)0x0) {
            LOCK();
            (((Data *)compilerVariable.m_string.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i =
                 (((Data *)compilerVariable.m_string.d.d)->super_QArrayData).ref_._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          pPVar23 = (ProString *)compilerVariable.m_string.d.ptr;
          for (lVar20 = compilerVariable.m_string.d.size * 0x30; lVar20 != 0;
              lVar20 = lVar20 + -0x30) {
            local_2b8.m_string.d.size = -0x5555555555555556;
            local_2b8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_2b8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            pQVar21 = (pUVar28->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)&local_b0,"QMAKE_PCH_OUTPUT_EXT");
            QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
            ProString::toQString(&local_2b8.m_string,&target);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_b0);
            pQVar19 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_ARCH}");
            ProString::toQString(&target.m_string,pPVar23);
            QString::replace((QLatin1String *)&local_2b8,pQVar19,0x21c339);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
            target.m_string.d.d =
                 (Data *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_OUTPUT_");
            target.m_string.d.ptr = L"${QMAKE_PCH_OUTPUT_";
            target.m_offset._0_1_ = 0x7d;
            target.m_string.d.size = (qsizetype)pPVar23;
            QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>::
            convertTo<QString>((QString *)&local_b0,
                               (QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                                *)&target);
            local_268._0_8_ = &runCompImp;
            local_268._8_8_ = &local_2b8;
            MakefileGenerator::escapeFilePath<QString&,QString&>
                      ((QString *)&local_2e8,&pUVar28->super_MakefileGenerator,
                       (QStringBuilder<QString_&,_QString_&> *)local_268);
            QString::replace((QString *)&runComp,(QString *)&local_b0,
                             (CaseSensitivity)(QArrayDataPointer<char16_t> *)&local_2e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_2e8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_b0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_2b8);
            pPVar23 = pPVar23 + 1;
          }
          QArrayDataPointer<ProString>::~QArrayDataPointer
                    ((QArrayDataPointer<ProString> *)&compilerVariable);
          ppQVar27 = ppQVar29;
        }
        else {
          compilerVariable.m_string.d.d = (Data *)0x0;
          compilerVariable.m_string.d.ptr = (char16_t *)0x0;
          compilerVariable.m_string.d.size = 0;
          pQVar21 = *ppQVar29;
          ppQVar27 = ppQVar29;
          QString::QString(&target.m_string,"clang_pch_style");
          bVar4 = QMakeProject::isActiveConfig(pQVar21,&target.m_string,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          if (bVar4) {
            pQVar21 = *ppQVar29;
            ProKey::ProKey((ProKey *)&local_b0,"QMAKE_PCH_OUTPUT_EXT");
            QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
            ProString::toQString(&local_2b8.m_string,&target);
            qVar17 = compilerVariable.m_string.d.size;
            pcVar16 = compilerVariable.m_string.d.ptr;
            pDVar3 = compilerVariable.m_string.d.d;
            compilerVariable.m_string.d.d = local_2b8.m_string.d.d;
            compilerVariable.m_string.d.ptr = local_2b8.m_string.d.ptr;
            local_2b8.m_string.d.d = pDVar3;
            local_2b8.m_string.d.ptr = pcVar16;
            compilerVariable.m_string.d.size = local_2b8.m_string.d.size;
            local_2b8.m_string.d.size = qVar17;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_2b8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_b0);
          }
          pQVar21 = *ppQVar29;
          ProKey::ProKey((ProKey *)&local_b0,"QMAKE_PCH_OUTPUT_EXT");
          QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
          ProString::toQString(&local_2b8.m_string,&target);
          QString::append((QString *)&runCompImp);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
          QString::append((QString *)&runCompImp);
          target.m_file = -0x55555556;
          target._36_4_ = 0xaaaaaaaa;
          target.m_hash = 0xaaaaaaaaaaaaaaaa;
          target.m_string.d.size = -0x5555555555555556;
          target.m_offset = -0x55555556;
          target.m_length = -0x55555556;
          target.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
          target.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
          pQVar21 = *ppQVar29;
          local_2b8.m_string.d.d = (Data *)0x21c36f;
          local_2b8.m_string.d.ptr = (char16_t *)iVar14.i;
          ProString::ProString<char_const(&)[16],ProString_const&>
                    ((ProString *)&local_b0,
                     (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)&local_2b8);
          QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
          if (target.m_length != 0) {
            pQVar19 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_OUTPUT}");
            local_2b8.m_string.d.ptr = (char16_t *)&target;
            pUVar31 = pUVar28;
            local_2b8.m_string.d.d = (Data *)&runCompImp;
            local_2b8.m_string.d.size = (qsizetype)&compilerVariable;
            MakefileGenerator::escapeFilePath<QStringBuilder<QString&,ProString&>,QString&>
                      ((QString *)&local_b0,&pUVar28->super_MakefileGenerator,
                       (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                       &local_2b8);
            QString::replace((QLatin1String *)&runComp,pQVar19,0x21c300);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_b0);
            local_2b8.m_string.d.size = -0x5555555555555556;
            local_2b8.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_2b8.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            pQVar21 = (pUVar28->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)&local_b0,"QMAKE_PCH_ARCHS");
            pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
            local_2b8.m_string.d.d = (Data *)(pPVar18->super_QList<ProString>).d.d;
            local_2b8.m_string.d.ptr = (char16_t *)(pPVar18->super_QList<ProString>).d.ptr;
            local_2b8.m_string.d.size = (pPVar18->super_QList<ProString>).d.size;
            if (local_2b8.m_string.d.d != (Data *)0x0) {
              LOCK();
              (((Data *)local_2b8.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i =
                   (((Data *)local_2b8.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_b0);
            pPVar23 = (ProString *)local_2b8.m_string.d.ptr;
            pUVar28 = pUVar31;
            for (lVar20 = local_2b8.m_string.d.size * 0x30; lVar20 != 0; lVar20 = lVar20 + -0x30) {
              local_2e8.super_ProString.m_string.d.size = -0x5555555555555556;
              local_2e8.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_2e8.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_b0.a.a.a.b = (char (*) [2])&target;
              local_b0.a.a.b = &compilerVariable.m_string;
              local_b0.a.a.a.a = (QString *)&runCompImp;
              QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>::convertTo<QString>
                        ((QString *)&local_2e8,
                         (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                         &local_b0);
              pQVar19 = (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_ARCH}");
              ProString::toQString((QString *)&local_b0,pPVar23);
              QString::replace((QLatin1String *)&local_2e8,pQVar19,0x21c339);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_b0);
              pQVar21 = *ppQVar27;
              QString::QString((QString *)&local_b0,"clang_pch_style");
              bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_b0,false);
              if (bVar4) {
                qVar17 = QtPrivate::lengthHelperPointer<char>(".pch");
                cVar7 = QString::endsWith((QLatin1String *)&local_2e8,(CaseSensitivity)qVar17);
                if (cVar7 == '\0') {
                  qVar17 = QtPrivate::lengthHelperPointer<char>(".gch");
                  cVar7 = QString::endsWith((QLatin1String *)&local_2e8,(CaseSensitivity)qVar17);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_b0);
                  pUVar31 = pUVar28;
                  if (cVar7 == '\0') goto LAB_00176f97;
                }
                else {
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_b0);
                }
                pUVar31 = pUVar28;
                QString::chop((longlong)&local_2e8);
              }
              else {
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_b0);
                pUVar31 = pUVar28;
              }
LAB_00176f97:
              local_b0.a.a.a.a =
                   (QString *)QtPrivate::lengthHelperPointer<char>("${QMAKE_PCH_OUTPUT_");
              local_b0.a.a.a.b = (char (*) [2])0x21c34b;
              local_b0.a.b = (char (*) [2])CONCAT71(local_b0.a.b._1_7_,0x7d);
              local_b0.a.a.b = &pPVar23->m_string;
              QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>::
              convertTo<QString>((QString *)local_268,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                                  *)&local_b0);
              (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo.
                _vptr_QMakeSourceFileInfo[0xc])
                        (&local_288,pUVar28,(QArrayDataPointer<char16_t> *)&local_2e8);
              QString::replace((QString *)&runComp,(QString *)local_268,(CaseSensitivity)&local_288)
              ;
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_268);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2e8);
              pPVar23 = pPVar23 + 1;
              pUVar28 = pUVar31;
            }
            QArrayDataPointer<ProString>::~QArrayDataPointer
                      ((QArrayDataPointer<ProString> *)&local_2b8);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&compilerVariable);
        }
        if (runComp.super_ProString.m_string.d.size != 0) {
          target.m_string.d.d = (Data *)0x21fe9e;
          target.m_string.d.ptr = (char16_t *)&runComp;
          ::operator+=((QString *)local_248,(QStringBuilder<const_char_(&)[2],_QString_&> *)&target)
          ;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runCompImp);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
        ppQVar29 = ppQVar27;
      }
    }
    local_268._0_8_ = (ProKey *)0x0;
    local_268._8_8_ = (ProString *)0x0;
    local_268._16_8_ = 0;
    bVar4 = ProString::operator==(iVar14.i,"C");
    ch = "$(CC)";
    pcVar24 = " $(CFLAGS)";
    if (!bVar4) {
      bVar4 = ProString::operator==(iVar14.i,"OBJC");
      ch = "$(CXX)";
      if (bVar4) {
        ch = "$(CC)";
      }
      pcVar24 = " $(CXXFLAGS)";
      if (bVar4) {
        pcVar24 = " $(CFLAGS)";
      }
    }
    QString::operator=((QString *)local_268,ch);
    QString::operator+=((QString *)local_248,pcVar24);
    QString::operator+=((QString *)local_248," $(INCPATH)");
    compilerVariable.m_file = -0x55555556;
    compilerVariable._36_4_ = 0xaaaaaaaa;
    compilerVariable.m_hash = 0xaaaaaaaaaaaaaaaa;
    compilerVariable.m_string.d.size = -0x5555555555555556;
    compilerVariable.m_offset = -0x55555556;
    compilerVariable.m_length = -0x55555556;
    compilerVariable.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    compilerVariable.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProString::ProString(&compilerVariable,iVar14.i);
    bVar4 = ProString::operator==(&compilerVariable,"C");
    if (bVar4) {
      ProString::ProString(&target,"CC");
      ProString::operator=(&compilerVariable,&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    }
    runComp.super_ProString.m_file = -0x55555556;
    runComp.super_ProString._36_4_ = 0xaaaaaaaa;
    runComp.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
    runComp.super_ProString.m_string.d.size = -0x5555555555555556;
    runComp.super_ProString.m_offset = -0x55555556;
    runComp.super_ProString.m_length = -0x55555556;
    runComp.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    runComp.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    target.m_string.d.d = (Data *)anon_var_dwarf_c44b8;
    target.m_string.d.ptr = (char16_t *)&compilerVariable;
    ProString::ProString<char_const(&)[11],ProString&>
              (&runComp.super_ProString,(QStringBuilder<const_char_(&)[11],_ProString_&> *)&target);
    bVar4 = QMakeProject::isEmpty(*ppQVar27,(ProKey *)&runComp.super_ProString);
    pUVar31 = pUVar28;
    if (bVar4) {
      pQVar9 = &QMakeEvaluator::valuesRef
                          (&((pUVar28->super_MakefileGenerator).project)->super_QMakeEvaluator,
                           &runComp)->super_QList<ProString>;
      ProKey::ProKey((ProKey *)&local_2b8,"QMAKE_CC_O_FLAG");
      (*(pUVar28->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16]
      )(&local_2e8,pUVar28,&local_2b8);
      local_b0.b.d.size = local_2e8.super_ProString.m_string.d.size;
      local_b0.b.d.ptr = local_2e8.super_ProString.m_string.d.ptr;
      local_b0.b.d.d = local_2e8.super_ProString.m_string.d.d;
      local_b0.a.a.a.a = (QString *)local_268;
      local_b0.a.a.a.b = (char (*) [2])0x21fe9e;
      local_b0.a.b = (char (*) [2])0x21fe9e;
      local_2e8.super_ProString.m_string.d.d = (Data *)0x0;
      local_2e8.super_ProString.m_string.d.ptr = (char16_t *)0x0;
      local_2e8.super_ProString.m_string.d.size = 0;
      local_b0.a.a.b = (QString *)local_248;
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
      ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                        *)&target,&local_b0);
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                (&runCompImp.super_ProString,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)&target);
      QList<ProString>::emplaceBack<ProString>(pQVar9,&runCompImp.super_ProString);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&runCompImp.super_ProString);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target.m_file)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0.b.d);
      ppQVar27 = ppQVar29;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
      ppQVar29 = ppQVar27;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
    }
    target.m_string.d.ptr = (char16_t *)&compilerVariable;
    runCompImp.super_ProString.m_file = -0x55555556;
    runCompImp.super_ProString._36_4_ = 0xaaaaaaaa;
    runCompImp.super_ProString.m_hash = 0xaaaaaaaaaaaaaaaa;
    runCompImp.super_ProString.m_string.d.size = -0x5555555555555556;
    runCompImp.super_ProString.m_offset = -0x55555556;
    runCompImp.super_ProString.m_length = -0x55555556;
    runCompImp.super_ProString.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    runCompImp.super_ProString.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    target.m_string.d.d = (Data *)anon_var_dwarf_c44b8;
    target.m_string.d.size = (long)"QMAKE_RUN_CC_IMP" + 0xc;
    ProString::ProString<QStringBuilder<char_const(&)[11],ProString&>,char_const(&)[5]>
              (&runCompImp.super_ProString,
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_ProString_&>,_const_char_(&)[5]> *
               )&target);
    bVar4 = QMakeProject::isEmpty(*ppQVar27,(ProKey *)&runCompImp.super_ProString);
    pUVar28 = pUVar31;
    if (bVar4) {
      pQVar9 = &QMakeEvaluator::valuesRef
                          (&((pUVar31->super_MakefileGenerator).project)->super_QMakeEvaluator,
                           (ProKey *)&runCompImp.super_ProString)->super_QList<ProString>;
      ProKey::ProKey(&local_2e8,"QMAKE_CC_O_FLAG");
      (*(pUVar31->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16]
      )(&local_288,pUVar31,&local_2e8);
      local_b0.b.d.size = local_288.size;
      local_b0.b.d.ptr = local_288.ptr;
      local_b0.b.d.d = local_288.d;
      local_b0.a.a.a.a = (QString *)local_268;
      local_b0.a.a.a.b = (char (*) [2])0x21fe9e;
      local_b0.a.a.b = (QString *)local_248;
      local_b0.a.b = (char (*) [2])0x21fe9e;
      local_288.d = (Data *)0x0;
      local_288.ptr = (char16_t *)0x0;
      local_288.size = 0;
      QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
      ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                        *)&target,&local_b0);
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                (&local_2b8,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)&target);
      QList<ProString>::emplaceBack<ProString>(pQVar9,&local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target.m_file)
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&runCompImp.super_ProString);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&compilerVariable);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_268);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_248);
  }
  pQVar21 = *ppQVar27;
  QString::QString(&compilerVariable.m_string,"mac");
  bVar4 = QMakeProject::isActiveConfig(pQVar21,&compilerVariable.m_string,false);
  if (bVar4) {
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&target,"TARGET");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
    if (bVar4) {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      goto LAB_001775ce;
    }
    pQVar21 = *ppQVar27;
    QString::QString((QString *)&runComp,"build_pass");
    bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)&runComp,false);
    if (!bVar4) {
      pQVar21 = *ppQVar27;
      ProKey::ProKey((ProKey *)&local_b0,"BUILDS");
      bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&compilerVariable);
      if (bVar4) goto LAB_00177dc1;
      goto LAB_001775db;
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&compilerVariable);
LAB_00177dc1:
    compilerVariable.m_file = -0x55555556;
    compilerVariable._36_4_ = 0xaaaaaaaa;
    compilerVariable.m_hash = 0xaaaaaaaaaaaaaaaa;
    compilerVariable.m_string.d.size = -0x5555555555555556;
    compilerVariable.m_offset = -0x55555556;
    compilerVariable.m_length = -0x55555556;
    compilerVariable.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    compilerVariable.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    ProString::ProString(&compilerVariable);
    pQVar21 = *ppQVar27;
    QString::QString((QString *)&local_b0,"bundle");
    bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_b0,false);
    if (bVar4) {
      pQVar21 = *ppQVar27;
      ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_EXTENSION");
      bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
      if (bVar4) goto LAB_00177ff2;
      pQVar21 = *ppQVar27;
      ProKey::ProKey((ProKey *)&local_b0,"TARGET");
      QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
      ProString::operator=(&compilerVariable,&target);
      ppQVar30 = ppQVar29;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
      pQVar21 = *ppQVar29;
      ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_NAME");
      bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      if (!bVar4) {
        pQVar21 = *ppQVar29;
        pQVar25 = &local_b0;
        ProKey::ProKey((ProKey *)pQVar25,"QMAKE_BUNDLE_NAME");
        pQVar26 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                   *)&target;
        QMakeEvaluator::first((ProString *)pQVar26,&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar25)
        ;
        ProString::operator=(&compilerVariable,(ProString *)pQVar26);
        ppQVar29 = ppQVar30;
LAB_00177f1e:
        ppQVar30 = ppQVar29;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar26);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar25);
      }
LAB_00177f33:
      pQVar21 = *ppQVar29;
      ProKey::ProKey((ProKey *)&local_b0,"QMAKE_BUNDLE_EXTENSION");
      QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
      bVar4 = ProString::endsWith(&compilerVariable,&target,CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
      if (!bVar4) {
        pQVar21 = *ppQVar30;
        pQVar26 = &local_b0;
        ProKey::ProKey((ProKey *)pQVar26,"QMAKE_BUNDLE_EXTENSION");
        pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                   *)&target;
        QMakeEvaluator::first((ProString *)pQVar25,&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar26)
        ;
        ProString::operator+=(&compilerVariable,(ProString *)pQVar25);
LAB_00177fd5:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar25);
        goto LAB_001783be;
      }
    }
    else {
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
LAB_00177ff2:
      pQVar21 = *ppQVar27;
      ProKey::ProKey((ProKey *)&local_b0,"TEMPLATE");
      QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
      bVar4 = ProString::operator==(&target,"app");
      if (bVar4) {
        pQVar21 = *ppQVar27;
        QString::QString((QString *)&runComp,"app_bundle");
        bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)&runComp,false);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        if (!bVar4) goto LAB_00178328;
        pQVar21 = *ppQVar27;
        ProKey::ProKey((ProKey *)&local_b0,"TARGET");
        QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
        ProString::operator=(&compilerVariable,&target);
        ppQVar30 = ppQVar29;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        pQVar21 = *ppQVar29;
        ProKey::ProKey((ProKey *)&target,"QMAKE_APPLICATION_BUNDLE_NAME");
        bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        if (!bVar4) {
          pQVar21 = *ppQVar29;
          ProKey::ProKey((ProKey *)&local_b0,"QMAKE_APPLICATION_BUNDLE_NAME");
          QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
          ppQVar29 = ppQVar30;
          ProString::operator=(&compilerVariable,&target);
          ppQVar30 = ppQVar29;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        }
        bVar4 = ProString::endsWith(&compilerVariable,".app",CaseSensitive);
        if (!bVar4) {
          ProString::append(&compilerVariable,".app");
        }
        pQVar21 = *ppQVar29;
        ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_LOCATION");
        bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        if (bVar4) {
          pQVar21 = *ppQVar29;
          ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_LOCATION");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
                    super_QList<ProString>;
          ProString::ProString((ProString *)&local_b0,"Contents/MacOS");
          QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_b0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        }
        pQVar21 = *ppQVar29;
        ProKey::ProKey(&runComp,"QMAKE_PKGINFO");
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,&runComp)->
                  super_QList<ProString>;
        pQVar21 = *ppQVar29;
        ProKey::ProKey(&local_2e8,"DESTDIR");
        QMakeEvaluator::first(&local_2b8,&pQVar21->super_QMakeEvaluator,&local_2e8);
        ProString::ProString((ProString *)&local_b0,&local_2b8);
        local_b0.b.d.size = (qsizetype)&compilerVariable;
        QStringBuilder<ProString,_ProString_&>::QStringBuilder
                  ((QStringBuilder<ProString,_ProString_&> *)&target,
                   (QStringBuilder<ProString,_ProString_&> *)&local_b0);
        ProString::ProString<QStringBuilder<ProString,ProString&>,char_const(&)[18]>
                  (&runCompImp.super_ProString,
                   (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_const_char_(&)[18]> *)
                   &target);
        QList<ProString>::emplaceBack<ProString>(pQVar9,&runCompImp.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&runCompImp.super_ProString);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_2e8);
        pQVar26 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                   *)&runComp;
      }
      else {
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
LAB_00178328:
        pQVar21 = *ppQVar27;
        ProKey::ProKey((ProKey *)&local_b0,"TEMPLATE");
        QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
        bVar4 = ProString::operator==(&target,"lib");
        ppQVar30 = ppQVar29;
        if (bVar4) {
          pQVar21 = *ppQVar27;
          QString::QString((QString *)&runComp,"staticlib");
          bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)&runComp,false);
          if (!bVar4) {
            pQVar21 = *ppQVar27;
            QString::QString((QString *)&runCompImp,"plugin");
            bVar4 = QMakeProject::isActiveConfig(pQVar21,(QString *)&runCompImp,false);
            if (bVar4) {
LAB_00178509:
              pQVar21 = *ppQVar27;
              QString::QString((QString *)&local_2e8,"plugin");
              bVar6 = false;
              bVar5 = QMakeProject::isActiveConfig(pQVar21,(QString *)&local_2e8,false);
              if (bVar5) {
                pQVar21 = *ppQVar29;
                QString::QString((QString *)local_248,"plugin_bundle");
                bVar6 = QMakeProject::isActiveConfig(pQVar21,(QString *)local_248,false);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_248);
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2e8);
              if (!bVar4) goto LAB_00178577;
            }
            else {
              pQVar21 = *ppQVar27;
              ppQVar27 = ppQVar29;
              QString::QString(&local_2b8.m_string,"lib_bundle");
              ppQVar29 = ppQVar27;
              bVar5 = QMakeProject::isActiveConfig(pQVar21,&local_2b8.m_string,false);
              bVar6 = true;
              if (!bVar5) goto LAB_00178509;
LAB_00178577:
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_2b8);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&runCompImp);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_b0);
            ppQVar30 = ppQVar29;
            if (bVar6 != false) {
              pQVar21 = *ppQVar29;
              ProKey::ProKey((ProKey *)&local_b0,"TARGET");
              QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
              ProString::operator=(&compilerVariable,&target);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_b0);
              pQVar21 = *ppQVar29;
              QString::QString(&target.m_string,"plugin");
              bVar4 = QMakeProject::isActiveConfig(pQVar21,&target.m_string,false);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
              pQVar21 = *ppQVar29;
              if (!bVar4) {
                ProKey::ProKey((ProKey *)&target,"QMAKE_FRAMEWORK_BUNDLE_NAME");
                bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&target);
                if (!bVar4) {
                  pQVar21 = *ppQVar29;
                  ProKey::ProKey((ProKey *)&local_b0,"QMAKE_FRAMEWORK_BUNDLE_NAME");
                  QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
                  ppQVar29 = ppQVar30;
                  ProString::operator=(&compilerVariable,&target);
                  ppQVar30 = ppQVar29;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&target);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)&local_b0);
                }
                pQVar21 = *ppQVar29;
                ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_EXTENSION");
                bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&target);
                if (bVar4) {
                  pQVar21 = *ppQVar29;
                  pQVar25 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                             *)&target;
                  ProKey::ProKey((ProKey *)pQVar25,"QMAKE_BUNDLE_EXTENSION");
                  pQVar9 = &QMakeEvaluator::valuesRef
                                      (&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar25)->
                            super_QList<ProString>;
                  pQVar26 = &local_b0;
                  ProString::ProString((ProString *)pQVar26,".framework");
                  QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)pQVar26);
                  ppQVar29 = ppQVar30;
                  goto LAB_00177f1e;
                }
                goto LAB_00177f33;
              }
              ProKey::ProKey((ProKey *)&target,"QMAKE_PLUGIN_BUNDLE_NAME");
              bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
              if (!bVar4) {
                pQVar21 = *ppQVar29;
                ProKey::ProKey((ProKey *)&local_b0,"QMAKE_PLUGIN_BUNDLE_NAME");
                QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
                ppQVar29 = ppQVar30;
                ProString::operator=(&compilerVariable,&target);
                ppQVar30 = ppQVar29;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&target);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_b0);
              }
              pQVar21 = *ppQVar29;
              ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_EXTENSION");
              bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
              if (bVar4) {
                pQVar21 = *ppQVar29;
                ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_EXTENSION");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
                          super_QList<ProString>;
                ProString::ProString((ProString *)&local_b0,".plugin");
                ppQVar29 = ppQVar30;
                QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)&local_b0);
                ppQVar30 = ppQVar29;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_b0);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&target);
              }
              pQVar21 = *ppQVar29;
              ProKey::ProKey((ProKey *)&local_b0,"QMAKE_BUNDLE_EXTENSION");
              QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
              bVar4 = ProString::endsWith(&compilerVariable,&target,CaseSensitive);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&local_b0);
              if (!bVar4) {
                pQVar21 = *ppQVar29;
                ProKey::ProKey((ProKey *)&local_b0,"QMAKE_BUNDLE_EXTENSION");
                QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
                ProString::operator+=(&compilerVariable,&target);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&target);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&local_b0);
              }
              pQVar21 = *ppQVar29;
              ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_LOCATION");
              bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)&target);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&target);
              if (bVar4) {
                pQVar21 = *ppQVar30;
                pQVar26 = (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>
                           *)&target;
                ProKey::ProKey((ProKey *)pQVar26,"QMAKE_BUNDLE_LOCATION");
                pQVar9 = &QMakeEvaluator::valuesRef
                                    (&pQVar21->super_QMakeEvaluator,(ProKey *)pQVar26)->
                          super_QList<ProString>;
                pQVar25 = &local_b0;
                ProString::ProString((ProString *)pQVar25,"Contents/MacOS");
                QList<ProString>::emplaceBack<ProString>(pQVar9,(ProString *)pQVar25);
                goto LAB_00177fd5;
              }
            }
            goto LAB_001783c3;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&runComp);
          ppQVar30 = ppQVar29;
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
        pQVar26 = &local_b0;
      }
LAB_001783be:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pQVar26);
    }
LAB_001783c3:
    if (compilerVariable.m_length == 0) {
      pQVar21 = *ppQVar30;
      ppQVar29 = ppQVar30;
      ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
                super_QList<ProString>;
      QList<ProString>::clear(pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      pQVar21 = *ppQVar30;
      ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE_LOCATION");
      pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
                super_QList<ProString>;
      QList<ProString>::clear(pQVar9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    }
    else {
      ProStringList::ProStringList((ProStringList *)&local_b0,&compilerVariable);
      pQVar21 = *ppQVar30;
      ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE");
      pQVar10 = (QArrayDataPointer<ProString> *)
                QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target);
      QArrayDataPointer<ProString>::operator=(pQVar10,(QArrayDataPointer<ProString> *)&local_b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_b0);
      ppQVar29 = ppQVar30;
    }
    pPVar23 = &compilerVariable;
  }
  else {
LAB_001775ce:
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&compilerVariable);
LAB_001775db:
    pQVar21 = *ppQVar27;
    ProKey::ProKey((ProKey *)&target,"QMAKE_BUNDLE");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&target)->
              super_QList<ProString>;
    QList<ProString>::clear(pQVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
    pQVar21 = *ppQVar27;
    pPVar23 = &target;
    ProKey::ProKey((ProKey *)pPVar23,"QMAKE_BUNDLE_LOCATION");
    pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)pPVar23)->
              super_QList<ProString>;
    QList<ProString>::clear(pQVar9);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)pPVar23);
  init2(pUVar28);
  target.m_file = -0x55555556;
  target._36_4_ = 0xaaaaaaaa;
  target.m_hash = 0xaaaaaaaaaaaaaaaa;
  target.m_string.d.size = -0x5555555555555556;
  target.m_offset = -0x55555556;
  target.m_length = -0x55555556;
  target.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  target.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar21 = (pUVar28->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)&local_b0,"TARGET");
  QMakeEvaluator::first(&target,&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  iVar8 = ProString::lastIndexOf(&target,&Option::dir_sep,-1,CaseSensitive);
  if (iVar8 != -1) {
    target.m_length = target.m_length - (iVar8 + 1);
    target.m_offset = target.m_offset + iVar8 + 1;
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)&local_b0,"LIB_TARGET");
  pQVar9 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)&local_b0)->
            super_QList<ProString>;
  QList<ProString>::emplaceFront<ProString_const&>(pQVar9,&target);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&target);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_218);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1f8);
LAB_00177733:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_1a8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void
UnixMakefileGenerator::init()
{
    ProStringList &configs = project->values("CONFIG");
    if(project->isEmpty("ICON") && !project->isEmpty("RC_FILE"))
        project->values("ICON") = project->values("RC_FILE");
    if(project->isEmpty("QMAKE_EXTENSION_PLUGIN"))
        project->values("QMAKE_EXTENSION_PLUGIN").append(project->first("QMAKE_EXTENSION_SHLIB"));

    project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");

    //version handling
    if (project->isEmpty("VERSION")) {
        project->values("VERSION").append(
            "1.0." + (project->isEmpty("VER_PAT") ? QString("0") : project->first("VER_PAT")));
    }
    QStringList l = project->first("VERSION").toQString().split('.');
    l << "0" << "0"; //make sure there are three
    project->values("VER_MAJ").append(l[0]);
    project->values("VER_MIN").append(l[1]);
    project->values("VER_PAT").append(l[2]);

    QString sroot = project->sourceRoot();
    for (const ProString &iif : project->values("QMAKE_INTERNAL_INCLUDED_FILES")) {
        if (iif == project->cacheFile())
            continue;
        if (iif.startsWith(sroot) && iif.at(sroot.size()) == QLatin1Char('/'))
            project->values("DISTFILES") += fileFixify(iif.toQString(), FileFixifyRelative);
    }

    /* this should probably not be here, but I'm using it to wrap the .t files */
    if(project->first("TEMPLATE") == "app")
        project->values("QMAKE_APP_FLAG").append("1");
    else if(project->first("TEMPLATE") == "lib")
        project->values("QMAKE_LIB_FLAG").append("1");
    else if(project->first("TEMPLATE") == "subdirs") {
        MakefileGenerator::init();
        if(project->isEmpty("MAKEFILE"))
            project->values("MAKEFILE").append("Makefile");
        return; /* subdirs is done */
    }

    project->values("QMAKE_ORIG_DESTDIR") = project->values("DESTDIR");
    if((!project->isEmpty("QMAKE_LIB_FLAG") && !project->isActiveConfig("staticlib")) ||
       (project->isActiveConfig("qt") &&  project->isActiveConfig("plugin"))) {
        if(configs.indexOf("dll") == -1) configs.append("dll");
    } else if(!project->isEmpty("QMAKE_APP_FLAG") || project->isActiveConfig("dll")) {
        configs.removeAll("staticlib");
    }
    if(!project->isEmpty("QMAKE_INCREMENTAL"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_INCREMENTAL");
    else if(!project->isEmpty("QMAKE_LFLAGS_PREBIND") &&
            !project->values("QMAKE_LIB_FLAG").isEmpty() &&
            project->isActiveConfig("dll"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PREBIND");
    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_RPATHDIR") += project->values("QMAKE_RPATHDIR_POST");
    project->values("QMAKE_RPATHLINKDIR") += project->values("QMAKE_RPATHLINKDIR_POST");
    if(!project->isEmpty("QMAKE_INCDIR"))
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");
    // The order of the next two lines is relevant due to side effect on QMAKE_LFLAGS.
    ProStringList ldadd = project->values("QMAKE_LIBDIR_FLAGS") + libdirToFlags("QMAKE_LIBDIR");
    ProStringList ldaddpost = libdirToFlags("QMAKE_LIBDIR_POST");
    if (project->isActiveConfig("mac")) {
        if (!project->isEmpty("QMAKE_FRAMEWORKPATH")) {
            const ProStringList &fwdirs = project->values("QMAKE_FRAMEWORKPATH");
            for (int i = 0; i < fwdirs.size(); ++i)
                project->values("QMAKE_FRAMEWORKPATH_FLAGS") += "-F" + escapeFilePath(fwdirs[i]);
        }
        ldadd += project->values("QMAKE_FRAMEWORKPATH_FLAGS");
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = ldadd + qmklibs;
    ProStringList &qmklibspost = project->values("QMAKE_LIBS");
    qmklibspost = ldaddpost + qmklibspost;
    if (!project->isEmpty("QMAKE_RPATHDIR") && !project->isEmpty("QMAKE_LFLAGS_RPATH")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            QString rpathdir = rpathdirs[i].toQString();
            if (rpathdir.size() > 1 && rpathdir.at(0) == '$' && rpathdir.at(1) != '(') {
                rpathdir.replace(0, 1, "\\$$");  // Escape from make and the shell
            } else if (!rpathdir.startsWith('@') && fileInfo(rpathdir).isRelative()) {
                QString rpathbase = project->first("QMAKE_REL_RPATH_BASE").toQString();
                if (rpathbase.isEmpty()) {
                    fprintf(stderr, "Error: This platform does not support relative paths in QMAKE_RPATHDIR (%s)\n",
                                    rpathdir.toLatin1().constData());
                    continue;
                }
                if (rpathbase.startsWith('$'))
                    rpathbase.replace(0, 1, "\\$$");  // Escape from make and the shell
                if (rpathdir == ".")
                    rpathdir = rpathbase;
                else
                    rpathdir.prepend(rpathbase + '/');
                project->values("QMAKE_LFLAGS").insertUnique(project->values("QMAKE_LFLAGS_REL_RPATH"));
            }
            project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATH") + escapeFilePath(rpathdir);
        }
    }
    if (!project->isEmpty("QMAKE_RPATHLINKDIR")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHLINKDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            if (!project->isEmpty("QMAKE_LFLAGS_RPATHLINK"))
                project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATHLINK") + escapeFilePath(QFileInfo(rpathdirs[i].toQString()).absoluteFilePath());
        }
    }

    if(project->isActiveConfig("GNUmake") && !project->isEmpty("QMAKE_CFLAGS_DEPS"))
        include_deps = true; //do not generate deps

    MakefileGenerator::init();

    if (project->isActiveConfig("objective_c"))
        project->values("QMAKE_BUILTIN_COMPILERS") << "OBJC" << "OBJCXX";

    for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
        QString compile_flag = var("QMAKE_COMPILE_FLAG");
        if(compile_flag.isEmpty())
            compile_flag = "-c";

        if(doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
            QString pchFlags = var(ProKey("QMAKE_" + compiler + "FLAGS_USE_PRECOMPILE"));

            QString pchBaseName;
            if(!project->isEmpty("PRECOMPILED_DIR")) {
                pchBaseName = Option::fixPathToTargetOS(project->first("PRECOMPILED_DIR").toQString());
                if(!pchBaseName.endsWith(Option::dir_sep))
                    pchBaseName += Option::dir_sep;
            }
            pchBaseName += project->first("QMAKE_ORIG_TARGET").toQString();

            // replace place holders
            pchFlags.replace(QLatin1String("${QMAKE_PCH_INPUT}"),
                             escapeFilePath(project->first("PRECOMPILED_HEADER").toQString()));
            pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_BASE}"), escapeFilePath(pchBaseName));
            if (project->isActiveConfig("icc_pch_style")) {
                // icc style
                pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                 escapeFilePath(pchBaseName + project->first("QMAKE_PCH_OUTPUT_EXT")));
                const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                for (const ProString &arch : pchArchs) {
                    QString suffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                    suffix.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                     escapeFilePath(pchBaseName + suffix));
                }
            } else {
                // gcc style (including clang_pch_style)
                QString headerSuffix;
                if (project->isActiveConfig("clang_pch_style"))
                    headerSuffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();

                pchBaseName += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                pchBaseName += Option::dir_sep;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (!language.isEmpty()) {
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                     escapeFilePath(pchBaseName + language + headerSuffix));
                    const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    for (const ProString &arch : pchArchs) {
                        QString file = pchBaseName + language + headerSuffix;
                        file.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                        if (project->isActiveConfig("clang_pch_style")
                            && (file.endsWith(QLatin1String(".pch"))
                                || file.endsWith(QLatin1String(".gch")))) {
                            file.chop(4); // must omit header suffix for -include to recognize the PCH
                        }
                        pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                         escapeFilePath(file));
                    }
                }
            }

            if (!pchFlags.isEmpty())
                compile_flag += " " + pchFlags;
        }

        QString compilerExecutable;
        if (compiler == "C" || compiler == "OBJC") {
            compilerExecutable = "$(CC)";
            compile_flag += " $(CFLAGS)";
        } else {
            compilerExecutable = "$(CXX)";
            compile_flag += " $(CXXFLAGS)";
        }

        compile_flag += " $(INCPATH)";

        ProString compilerVariable = compiler;
        if (compilerVariable == "C")
            compilerVariable = ProString("CC");

        const ProKey runComp("QMAKE_RUN_" + compilerVariable);
        if(project->isEmpty(runComp))
            project->values(runComp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "$obj $src");
        const ProKey runCompImp("QMAKE_RUN_" + compilerVariable + "_IMP");
        if(project->isEmpty(runCompImp))
            project->values(runCompImp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "\"$@\" \"$<\"");
    }

    if (project->isActiveConfig("mac") && !project->isEmpty("TARGET") &&
       ((project->isActiveConfig("build_pass") || project->isEmpty("BUILDS")))) {
        ProString bundle;
        if(project->isActiveConfig("bundle") && !project->isEmpty("QMAKE_BUNDLE_EXTENSION")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_BUNDLE_NAME"))
                bundle = project->first("QMAKE_BUNDLE_NAME");
            if(!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                bundle += project->first("QMAKE_BUNDLE_EXTENSION");
        } else if(project->first("TEMPLATE") == "app" && project->isActiveConfig("app_bundle")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_APPLICATION_BUNDLE_NAME"))
                bundle = project->first("QMAKE_APPLICATION_BUNDLE_NAME");
            if(!bundle.endsWith(".app"))
                bundle += ".app";
            if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            project->values("QMAKE_PKGINFO").append(project->first("DESTDIR") + bundle + "/Contents/PkgInfo");
        } else if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib") &&
                  ((!project->isActiveConfig("plugin") && project->isActiveConfig("lib_bundle")) ||
                   (project->isActiveConfig("plugin") && project->isActiveConfig("plugin_bundle")))) {
            bundle = project->first("TARGET");
            if(project->isActiveConfig("plugin")) {
                if(!project->isEmpty("QMAKE_PLUGIN_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_PLUGIN_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".plugin");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
                if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                    project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            } else {
                if(!project->isEmpty("QMAKE_FRAMEWORK_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_FRAMEWORK_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".framework");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
            }
        }
        if(!bundle.isEmpty()) {
            project->values("QMAKE_BUNDLE") = ProStringList(bundle);
        } else {
            project->values("QMAKE_BUNDLE").clear();
            project->values("QMAKE_BUNDLE_LOCATION").clear();
        }
    } else { //no bundling here
        project->values("QMAKE_BUNDLE").clear();
        project->values("QMAKE_BUNDLE_LOCATION").clear();
    }

    init2();
    ProString target = project->first("TARGET");
    int slsh = target.lastIndexOf(Option::dir_sep);
    if (slsh != -1)
        target.chopFront(slsh + 1);
    project->values("LIB_TARGET").prepend(target);
}